

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O0

void __thiscall OpenMD::Sticky::initialize(Sticky *this)

{
  bool bVar1;
  iterator this_00;
  iterator __new_size;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> *in_RDI;
  AtomType *unaff_retaddr;
  iterator at;
  AtomType *in_stack_00000108;
  Sticky *in_stack_00000110;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *this_01;
  _Self local_38;
  _Base_ptr local_30;
  value_type_conflict1 *in_stack_ffffffffffffffe0;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2b8e6c);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2b8e7a);
  std::
  vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
           *)0x2b8e88);
  *(undefined4 *)&in_RDI[0xe]._M_node = 0;
  this_01 = (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *
            )(in_RDI + 8);
  ForceField::getNAtomType((ForceField *)0x2b8ea8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(0xffffffff,in_stack_fffffffffffffff0),
             (size_type)in_stack_ffffffffffffffe8._M_node,in_stack_ffffffffffffffe0);
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)&stack0xffffffffffffffe8);
  this_00 = std::
            set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
            begin(this_01);
  while( true ) {
    __new_size = std::
                 set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                 ::end(this_01);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffd8);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
    bVar1 = AtomType::isSticky(unaff_retaddr);
    if (bVar1) {
      *(int *)&in_RDI[0xe]._M_node = *(int *)&in_RDI[0xe]._M_node + 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(in_RDI);
  }
  std::
  vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
            *)this_00._M_node,(size_type)__new_size._M_node);
  local_30 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin(this_01);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end(this_01);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_38);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
    bVar1 = AtomType::isSticky(unaff_retaddr);
    if (bVar1) {
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
      addType(in_stack_00000110,in_stack_00000108);
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(in_RDI);
  }
  *(undefined1 *)&in_RDI[1]._M_node = 1;
  return;
}

Assistant:

void Sticky::initialize() {
    Stypes.clear();
    Stids.clear();
    MixingMap.clear();
    nSticky_ = 0;

    Stids.resize(forceField_->getNAtomType(), -1);

    // Sticky handles all of the Sticky-Sticky interactions

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSticky()) nSticky_++;
    }

    MixingMap.resize(nSticky_);

    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSticky()) addType(*at);
    }

    initialized_ = true;
  }